

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::AckMessageTest_TestCannotConstructWithNegativeHandlingDuration_Test
::TestBody(AckMessageTest_TestCannotConstructWithNegativeHandlingDuration_Test *this)

{
  bool bVar1;
  AssertHelper local_80;
  Message local_78 [2];
  invalid_argument *anon_var_0;
  AckMessage local_60 [71];
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AckMessageTest_TestCannotConstructWithNegativeHandlingDuration_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bidfx_public_api::price::pixie::AckMessage::AckMessage(local_60,0,0,0,0,-0x4d2);
    }
    if ((local_19 & 1) != 0) {
      return;
    }
    pcStack_18 = 
    "Expected: AckMessage(0, 0, 0, 0, -1234) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/ack_message_test.cpp"
             ,0x22,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_80,local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::Message::~Message(local_78);
  return;
}

Assistant:

TEST(AckMessageTest, TestCannotConstructWithNegativeHandlingDuration)
{
    ASSERT_THROW(AckMessage(0, 0, 0, 0, -1234), std::invalid_argument);
}